

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::initialize
          (BerdySparseMAPSolverPimpl *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  double *pdVar5;
  undefined8 *in_RDI;
  Vector3 initialGravity;
  Triplets identityTriplets;
  size_t numberOfMeasurements;
  size_t numberOfDynEquations;
  size_t numberOfDynVariables;
  undefined1 in_stack_00000c8f;
  BerdySparseMAPSolverPimpl *in_stack_00000c90;
  Index in_stack_ffffffffffffff30;
  Index in_stack_ffffffffffffff38;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff40;
  VectorFixSize<3U> local_68;
  Vector3 *in_stack_ffffffffffffffb0;
  FrameIndex *in_stack_ffffffffffffffb8;
  JointDOFsDoubleArray *in_stack_ffffffffffffffc0;
  JointPosDoubleArray *in_stack_ffffffffffffffc8;
  BerdyHelper *in_stack_ffffffffffffffd0;
  
  *(undefined1 *)(in_RDI + 1) = 0;
  bVar1 = BerdyHelper::isValid((BerdyHelper *)*in_RDI);
  if (bVar1) {
    sVar2 = BerdyHelper::getNrOfDynamicVariables((BerdyHelper *)*in_RDI);
    sVar3 = BerdyHelper::getNrOfDynamicEquations((BerdyHelper *)*in_RDI);
    sVar4 = BerdyHelper::getNrOfSensorsMeasurements((BerdyHelper *)*in_RDI);
    BerdyHelper::model((BerdyHelper *)*in_RDI);
    iDynTree::JointPosDoubleArray::resize((Model *)(in_RDI + 0x4f));
    iDynTree::VectorDynSize::zero();
    BerdyHelper::model((BerdyHelper *)*in_RDI);
    iDynTree::JointDOFsDoubleArray::resize((Model *)(in_RDI + 0x53));
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x57));
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x6c));
    iDynTree::VectorDynSize::zero();
    Eigen::SparseMatrix<double,_0,_int>::resize
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    Eigen::SparseMatrix<double,_0,_int>::resize
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x5b));
    iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x68));
    iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x79));
    iDynTree::VectorDynSize::zero();
    Triplets::Triplets((Triplets *)0x5a6ab6);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize((ulong)(in_RDI + 2),sVar3);
    iDynTree::Triplets::reserve((ulong)&stack0xffffffffffffffc0);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&stack0xffffffffffffffc0,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)(in_RDI + 2));
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize((ulong)(in_RDI + 0xf),sVar2);
    iDynTree::Triplets::clear();
    iDynTree::Triplets::reserve((ulong)&stack0xffffffffffffffc0);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&stack0xffffffffffffffc0,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)(in_RDI + 0xf));
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize((ulong)(in_RDI + 0x20),sVar4)
    ;
    iDynTree::Triplets::clear();
    iDynTree::Triplets::reserve((ulong)&stack0xffffffffffffffc0);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&stack0xffffffffffffffc0,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)(in_RDI + 0x20));
    iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x1c));
    iDynTree::VectorDynSize::zero();
    VectorFixSize<3U>::VectorFixSize(&local_68);
    VectorFixSize<3U>::zero(&local_68);
    pdVar5 = VectorFixSize<3U>::operator()(&local_68,2);
    *pdVar5 = -9.81;
    BerdyHelper::dynamicTraversal((BerdyHelper *)*in_RDI);
    iDynTree::Traversal::getBaseLink();
    iDynTree::Link::getIndex();
    BerdyHelper::updateKinematicsFromFixedBase
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    computeMAP(in_stack_00000c90,(bool)in_stack_00000c8f);
    *(undefined1 *)(in_RDI + 1) = 1;
    Triplets::~Triplets((Triplets *)0x5a6d44);
  }
  return bVar1;
}

Assistant:

bool BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::initialize()
    {
        valid = false;
        if (!berdy.isValid()) return false;
        // Resize internal variables
        size_t numberOfDynVariables = berdy.getNrOfDynamicVariables();
        size_t numberOfDynEquations = berdy.getNrOfDynamicEquations();
        size_t numberOfMeasurements = berdy.getNrOfSensorsMeasurements();

        jointsConfiguration.resize(berdy.model());
        jointsConfiguration.zero();
        jointsVelocity.resize(berdy.model());
        jointsVelocity.zero();

        measurements.resize(numberOfMeasurements);
        measurements.zero();

        expectedDynamicsAPosteriori.resize(numberOfDynVariables);
        expectedDynamicsAPosteriori.zero();
        covarianceDynamicsAPosterioriInverse.resize(numberOfDynVariables, numberOfDynVariables);

        covarianceDynamicsPriorInverse.resize(numberOfDynVariables, numberOfDynVariables);
        expectedDynamicsPrior.resize(numberOfDynVariables);
        expectedDynamicsPriorRHS.resize(numberOfDynVariables);
        expectedDynamicsAPosterioriRHS.resize(numberOfDynVariables);
        expectedDynamicsAPosterioriRHS.zero();

        // Resize priors and set them to identity.
        // If a prior is specified in config file they will be cleared after
        iDynTree::Triplets identityTriplets;
        priorDynamicsConstraintsCovarianceInverse.resize(numberOfDynEquations, numberOfDynEquations);
        identityTriplets.reserve(numberOfDynEquations);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfDynEquations);
        priorDynamicsConstraintsCovarianceInverse.setFromTriplets(identityTriplets);

        priorDynamicsRegularizationCovarianceInverse.resize(numberOfDynVariables, numberOfDynVariables);
        identityTriplets.clear();
        identityTriplets.reserve(numberOfDynVariables);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfDynVariables);
        priorDynamicsRegularizationCovarianceInverse.setFromTriplets(identityTriplets);

        priorMeasurementsCovarianceInverse.resize(numberOfMeasurements, numberOfMeasurements);
        identityTriplets.clear();
        identityTriplets.reserve(numberOfMeasurements);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfMeasurements);
        priorMeasurementsCovarianceInverse.setFromTriplets(identityTriplets);

        priorDynamicsRegularizationExpectedValue.resize(numberOfDynVariables);
        priorDynamicsRegularizationExpectedValue.zero();

        Vector3 initialGravity;
        initialGravity.zero();
        initialGravity(2) = -9.81;

        berdy.updateKinematicsFromFixedBase(jointsConfiguration, jointsVelocity, berdy.dynamicTraversal().getBaseLink()->getIndex(), initialGravity);
        computeMAP(true);

        valid = true;
        return true;
    }